

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,SubscriptionSync *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"SubscriptionSync(edition=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", compressed=");
  pcVar3 = "false";
  pcVar2 = "true";
  if ((this->options_ & 1) == 0) {
    pcVar2 = "false";
  }
  std::operator<<(local_1a0,pcVar2);
  poVar1 = std::operator<<(local_1a0,", controls=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", changed=");
  if ((this->options_ & 4) == 0) {
    pcVar3 = "true";
  }
  std::operator<<(local_1a0,pcVar3);
  poVar1 = std::operator<<(local_1a0,", subjects=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string SubscriptionSync::Summarize()
{
    std::stringstream ss;
    ss << "SubscriptionSync(edition=" << edition_ <<
          ", compressed=";

    IsCompressed() ? ss << "true" : ss << "false";

    ss << ", controls=" << controls_.size() << ", changed=";

    IsChangedEdition() ? ss << "true" : ss << "false";

    ss << ", subjects=" << size_ << ")";

    return ss.str();
}